

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChUtilsGenerators.cpp
# Opt level: O3

void __thiscall
chrono::utils::Generator::createObjects(Generator *this,PointVector *points,ChVector<double> *vel)

{
  ChBodyFrame *this_00;
  element_type *peVar1;
  MixtureIngredient *pMVar2;
  element_type *peVar3;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var4;
  ChSystem *pCVar5;
  long *plVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  PointVector *pPVar9;
  int iVar10;
  int iVar11;
  ChBody *this_01;
  pointer pCVar12;
  pointer pCVar13;
  ulong uVar14;
  long lVar15;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var16;
  ulong uVar17;
  shared_ptr<chrono::ChMaterialSurface> mat;
  shared_ptr<chrono::ChBody> bodyPtr;
  shared_ptr<chrono::ChMaterialSurfaceSMC> matSMC;
  ChVector<double> size;
  double volume;
  ChVector<double> gyration;
  ChMaterialSurfaceSMC *local_2a8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_2a0;
  ChVector<double> local_298;
  double local_278;
  double dStack_270;
  BodyInfo local_268;
  ChVector<double> local_228;
  double local_208;
  undefined8 uStack_200;
  PointVector *local_1f0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_1e8;
  vector<bool,_std::allocator<bool>_> local_1e0;
  ChBody *local_1b8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1b0;
  ChBody *local_1a8;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_1a0;
  shared_ptr<chrono::ChMaterialSurface> local_198;
  shared_ptr<chrono::ChMaterialSurface> local_188;
  shared_ptr<chrono::ChMaterialSurface> local_178;
  shared_ptr<chrono::ChMaterialSurface> local_168;
  shared_ptr<chrono::ChMaterialSurface> local_158;
  shared_ptr<chrono::ChMaterialSurface> local_148;
  shared_ptr<chrono::ChMaterialSurface> local_138;
  shared_ptr<chrono::ChMaterialSurface> local_128;
  shared_ptr<chrono::ChMaterialSurfaceSMC> local_118;
  shared_ptr<chrono::ChMaterialSurfaceNSC> local_108;
  double local_f0;
  vector<chrono::utils::Generator::BodyInfo,_std::allocator<chrono::utils::Generator::BodyInfo>_>
  *local_e8;
  ChVector<double> *local_e0;
  element_type *local_d8;
  double local_d0;
  ChVector<double> local_c8;
  shared_ptr<chrono::ChVisualMaterial> local_b0;
  shared_ptr<chrono::ChVisualMaterial> local_a0;
  shared_ptr<chrono::ChVisualMaterial> local_90;
  shared_ptr<chrono::ChVisualMaterial> local_80;
  shared_ptr<chrono::ChVisualMaterial> local_70;
  shared_ptr<chrono::ChVisualMaterial> local_60;
  shared_ptr<chrono::ChVisualMaterial> local_50;
  shared_ptr<chrono::ChVisualMaterial> local_40;
  undefined4 extraout_var;
  
  local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
  super__Bit_iterator_base._M_offset = 0;
  local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
  super__Bit_iterator_base._M_offset = 0;
  local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  local_d8 = (this->m_callback).
             super___shared_ptr<chrono::utils::Generator::CreateObjectsCallback,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
  local_e0 = vel;
  if (local_d8 != (element_type *)0x0) {
    std::vector<bool,_std::allocator<bool>_>::resize
              (&local_1e0,
               ((long)(points->
                      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(points->
                      super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,true);
    peVar1 = (this->m_callback).
             super___shared_ptr<chrono::utils::Generator::CreateObjectsCallback,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr;
    (**(code **)(*(long *)peVar1 + 0x10))(peVar1,points,&local_1e0);
  }
  pCVar13 = (points->
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            )._M_impl.super__Vector_impl_data._M_finish;
  pCVar12 = (points->
            super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  if (pCVar13 == pCVar12) {
    uVar14 = 0;
  }
  else {
    local_e8 = &this->m_bodies;
    lVar15 = 0;
    uVar17 = 0;
    local_1f0 = points;
    do {
      if ((local_d8 == (element_type *)0x0) ||
         ((local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
           _M_start.super__Bit_iterator_base._M_p[uVar17 >> 6 & 0x3ffffff] >> (uVar17 & 0x3f) & 1)
          != 0)) {
        iVar10 = selectIngredient(this);
        local_2a8 = (ChMaterialSurfaceSMC *)0x0;
        _Stack_2a0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        iVar11 = (*(this->m_system->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable
                   [0x2f])();
        if (iVar11 == 0) {
          local_268._0_8_ = (ChMaterialSurfaceSMC *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<chrono::ChMaterialSurfaceNSC,std::allocator<chrono::ChMaterialSurfaceNSC>>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_268.m_density,
                     (ChMaterialSurfaceNSC **)&local_268,
                     (allocator<chrono::ChMaterialSurfaceNSC> *)&local_228);
          pMVar2 = (this->m_mixture).
                   super__Vector_base<std::shared_ptr<chrono::utils::MixtureIngredient>,_std::allocator<std::shared_ptr<chrono::utils::MixtureIngredient>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar10].
                   super___shared_ptr<chrono::utils::MixtureIngredient,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          local_108.super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)local_268._0_8_;
          local_108.super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268.m_density;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268.m_density !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)((long)local_268.m_density + 8) =
                   *(_Atomic_word *)((long)local_268.m_density + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)((long)local_268.m_density + 8) =
                   *(_Atomic_word *)((long)local_268.m_density + 8) + 1;
            }
          }
          MixtureIngredient::setMaterialProperties(pMVar2,&local_108);
          _Var16._M_pi = local_108.
                         super___shared_ptr<chrono::ChMaterialSurfaceNSC,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
LAB_0091862a:
          if (_Var16._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var16._M_pi);
          }
          local_2a8 = (ChMaterialSurfaceSMC *)local_268._0_8_;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                    (&_Stack_2a0,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_268.m_density)
          ;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268.m_density !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268.m_density);
          }
        }
        else if (iVar11 == 1) {
          local_268._0_8_ = (ChMaterialSurfaceSMC *)0x0;
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
          __shared_count<chrono::ChMaterialSurfaceSMC,std::allocator<chrono::ChMaterialSurfaceSMC>>
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_268.m_density,
                     (ChMaterialSurfaceSMC **)&local_268,
                     (allocator<chrono::ChMaterialSurfaceSMC> *)&local_228);
          pMVar2 = (this->m_mixture).
                   super__Vector_base<std::shared_ptr<chrono::utils::MixtureIngredient>,_std::allocator<std::shared_ptr<chrono::utils::MixtureIngredient>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar10].
                   super___shared_ptr<chrono::utils::MixtureIngredient,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr;
          local_118.super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>.
          _M_ptr = (element_type *)local_268._0_8_;
          local_118.super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268.m_density;
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_268.m_density !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)((long)local_268.m_density + 8) =
                   *(_Atomic_word *)((long)local_268.m_density + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)((long)local_268.m_density + 8) =
                   *(_Atomic_word *)((long)local_268.m_density + 8) + 1;
            }
          }
          MixtureIngredient::setMaterialProperties(pMVar2,&local_118);
          _Var16._M_pi = local_118.
                         super___shared_ptr<chrono::ChMaterialSurfaceSMC,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount._M_pi;
          goto LAB_0091862a;
        }
        iVar11 = (*(this->m_system->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable
                   [0x30])();
        this_01 = (ChBody *)CONCAT44(extraout_var,iVar11);
        iVar11 = this->m_crtBodyId;
        this->m_crtBodyId = iVar11 + 1;
        (this_01->super_ChPhysicsItem).super_ChObj.m_identifier = iVar11;
        pCVar12 = (local_1f0->
                  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        if ((ChCoordsys<double> *)((long)pCVar12->m_data + lVar15) !=
            &(this_01->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord) {
          (this_01->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.
          m_data[0] = *(double *)((long)pCVar12->m_data + lVar15);
          (this_01->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.
          m_data[1] = *(double *)((long)pCVar12->m_data + lVar15 + 8);
          (this_01->super_ChBodyFrame).super_ChFrameMoving<double>.super_ChFrame<double>.coord.pos.
          m_data[2] = *(double *)((long)pCVar12->m_data + lVar15 + 0x10);
        }
        this_00 = &this_01->super_ChBodyFrame;
        local_268._0_8_ = (ChMaterialSurfaceSMC *)0x3ff0000000000000;
        local_268.m_density = 0.0;
        local_268.m_size.m_data[0] = 0.0;
        local_268.m_size.m_data[1] = 0.0;
        ChFrame<double>::SetRot((ChFrame<double> *)this_00,(ChQuaternion<double> *)&local_268);
        (*(this_00->super_ChFrameMoving<double>).super_ChFrame<double>._vptr_ChFrame[7])(this_00);
        ChBody::SetBodyFixed(this_01,false);
        ChBody::SetCollide(this_01,true);
        MixtureIngredient::getSize
                  (&local_228,
                   (this->m_mixture).
                   super__Vector_base<std::shared_ptr<chrono::utils::MixtureIngredient>,_std::allocator<std::shared_ptr<chrono::utils::MixtureIngredient>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar10].
                   super___shared_ptr<chrono::utils::MixtureIngredient,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr);
        local_1e8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                    MixtureIngredient::getDensity
                              ((this->m_mixture).
                               super__Vector_base<std::shared_ptr<chrono::utils::MixtureIngredient>,_std::allocator<std::shared_ptr<chrono::utils::MixtureIngredient>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[iVar10].
                               super___shared_ptr<chrono::utils::MixtureIngredient,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr);
        local_c8.m_data[2] = 0.0;
        local_c8.m_data[0] = 0.0;
        local_c8.m_data[1] = 0.0;
        MixtureIngredient::calcGeometricProps
                  ((this->m_mixture).
                   super__Vector_base<std::shared_ptr<chrono::utils::MixtureIngredient>,_std::allocator<std::shared_ptr<chrono::utils::MixtureIngredient>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar10].
                   super___shared_ptr<chrono::utils::MixtureIngredient,_(__gnu_cxx::_Lock_policy)2>.
                   _M_ptr,&local_228,&local_d0,&local_c8);
        local_208 = local_d0;
        uStack_200 = 0;
        local_278 = local_d0 * (double)local_1e8;
        dStack_270 = 0.0;
        ChVariablesBodyOwnMass::SetBodyMass(&this_01->variables,local_278);
        local_268.m_size.m_data[0] = local_278 * local_c8.m_data[2];
        dStack_270 = local_278;
        local_268._0_8_ = local_278 * local_c8.m_data[0];
        local_268.m_density = local_278 * local_c8.m_data[1];
        ChBody::SetInertiaXX(this_01,(ChVector<double> *)&local_268);
        auVar7._8_8_ = dStack_270;
        auVar7._0_8_ = local_278;
        auVar8._8_8_ = uStack_200;
        auVar8._0_8_ = local_208;
        auVar7 = vunpcklpd_avx(auVar7,auVar8);
        this->m_totalMass = auVar7._0_8_ + this->m_totalMass;
        this->m_totalVolume = auVar7._8_8_ + this->m_totalVolume;
        peVar3 = (this_01->collision_model).
                 super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        p_Var4 = (this_01->collision_model).
                 super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          }
        }
        (*peVar3->_vptr_ChCollisionModel[3])();
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
        }
        switch(((this->m_mixture).
                super__Vector_base<std::shared_ptr<chrono::utils::MixtureIngredient>,_std::allocator<std::shared_ptr<chrono::utils::MixtureIngredient>_>_>
                ._M_impl.super__Vector_impl_data._M_start[iVar10].
                super___shared_ptr<chrono::utils::MixtureIngredient,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr)->m_type) {
        case SPHERE:
          local_128.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = &local_2a8->super_ChMaterialSurface;
          local_128.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = _Stack_2a0._M_pi;
          if (_Stack_2a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (_Stack_2a0._M_pi)->_M_use_count = (_Stack_2a0._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (_Stack_2a0._M_pi)->_M_use_count = (_Stack_2a0._M_pi)->_M_use_count + 1;
            }
          }
          local_298.m_data[2] = 0.0;
          local_268._0_8_ = (ChMaterialSurfaceSMC *)0x3ff0000000000000;
          local_268.m_size.m_data[1] = 0.0;
          local_278 = local_228.m_data[0];
          local_298.m_data[0] = 0.0;
          local_298.m_data[1] = 0.0;
          local_268.m_density = 0.0;
          local_268.m_size.m_data[0] = 0.0;
          ChVisualMaterial::Default();
          AddSphereGeometry(this_01,&local_128,local_278,&local_298,
                            (ChQuaternion<double> *)&local_268,true,&local_40);
          _Var16._M_pi = local_128.
                         super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          if (local_40.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_40.
                       super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            _Var16._M_pi = local_128.
                           super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
          }
          break;
        case ELLIPSOID:
          local_138.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = &local_2a8->super_ChMaterialSurface;
          local_138.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = _Stack_2a0._M_pi;
          if (_Stack_2a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (_Stack_2a0._M_pi)->_M_use_count = (_Stack_2a0._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (_Stack_2a0._M_pi)->_M_use_count = (_Stack_2a0._M_pi)->_M_use_count + 1;
            }
          }
          local_298.m_data[2] = 0.0;
          local_268._0_8_ = (ChMaterialSurfaceSMC *)0x3ff0000000000000;
          local_298.m_data[0] = 0.0;
          local_298.m_data[1] = 0.0;
          local_268.m_size.m_data[1] = 0.0;
          local_268.m_density = 0.0;
          local_268.m_size.m_data[0] = 0.0;
          ChVisualMaterial::Default();
          AddEllipsoidGeometry
                    (this_01,&local_138,&local_228,&local_298,(ChQuaternion<double> *)&local_268,
                     true,&local_50);
          _Var16._M_pi = local_138.
                         super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          if (local_50.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_50.
                       super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            _Var16._M_pi = local_138.
                           super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
          }
          break;
        case BOX:
          local_148.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = &local_2a8->super_ChMaterialSurface;
          local_148.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = _Stack_2a0._M_pi;
          if (_Stack_2a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (_Stack_2a0._M_pi)->_M_use_count = (_Stack_2a0._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (_Stack_2a0._M_pi)->_M_use_count = (_Stack_2a0._M_pi)->_M_use_count + 1;
            }
          }
          local_298.m_data[2] = 0.0;
          local_268._0_8_ = (ChMaterialSurfaceSMC *)0x3ff0000000000000;
          local_298.m_data[0] = 0.0;
          local_298.m_data[1] = 0.0;
          local_268.m_size.m_data[1] = 0.0;
          local_268.m_density = 0.0;
          local_268.m_size.m_data[0] = 0.0;
          ChVisualMaterial::Default();
          AddBoxGeometry(this_01,&local_148,&local_228,&local_298,(ChQuaternion<double> *)&local_268
                         ,true,&local_60);
          _Var16._M_pi = local_148.
                         super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          if (local_60.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_60.
                       super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            _Var16._M_pi = local_148.
                           super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
          }
          break;
        case CYLINDER:
          local_158.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = &local_2a8->super_ChMaterialSurface;
          local_158.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = _Stack_2a0._M_pi;
          if (_Stack_2a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (_Stack_2a0._M_pi)->_M_use_count = (_Stack_2a0._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (_Stack_2a0._M_pi)->_M_use_count = (_Stack_2a0._M_pi)->_M_use_count + 1;
            }
          }
          local_298.m_data[2] = 0.0;
          local_268._0_8_ = (ChMaterialSurfaceSMC *)0x3ff0000000000000;
          local_268.m_size.m_data[1] = 0.0;
          local_278 = local_228.m_data[0];
          local_208 = local_228.m_data[1];
          local_298.m_data[0] = 0.0;
          local_298.m_data[1] = 0.0;
          local_268.m_density = 0.0;
          local_268.m_size.m_data[0] = 0.0;
          ChVisualMaterial::Default();
          AddCylinderGeometry(this_01,&local_158,local_278,local_208,&local_298,
                              (ChQuaternion<double> *)&local_268,true,&local_70);
          _Var16._M_pi = local_158.
                         super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          if (local_70.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_70.
                       super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            _Var16._M_pi = local_158.
                           super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
          }
          break;
        case CONE:
          local_168.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = &local_2a8->super_ChMaterialSurface;
          local_168.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = _Stack_2a0._M_pi;
          if (_Stack_2a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (_Stack_2a0._M_pi)->_M_use_count = (_Stack_2a0._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (_Stack_2a0._M_pi)->_M_use_count = (_Stack_2a0._M_pi)->_M_use_count + 1;
            }
          }
          local_298.m_data[2] = 0.0;
          local_268._0_8_ = (ChMaterialSurfaceSMC *)0x3ff0000000000000;
          local_268.m_size.m_data[1] = 0.0;
          local_278 = local_228.m_data[0];
          local_208 = local_228.m_data[1];
          local_298.m_data[0] = 0.0;
          local_298.m_data[1] = 0.0;
          local_268.m_density = 0.0;
          local_268.m_size.m_data[0] = 0.0;
          ChVisualMaterial::Default();
          AddConeGeometry(this_01,&local_168,local_278,local_208,&local_298,
                          (ChQuaternion<double> *)&local_268,true,&local_80);
          _Var16._M_pi = local_168.
                         super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          if (local_80.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_80.
                       super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            _Var16._M_pi = local_168.
                           super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
          }
          break;
        case CAPSULE:
          local_188.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = &local_2a8->super_ChMaterialSurface;
          local_188.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = _Stack_2a0._M_pi;
          if (_Stack_2a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (_Stack_2a0._M_pi)->_M_use_count = (_Stack_2a0._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (_Stack_2a0._M_pi)->_M_use_count = (_Stack_2a0._M_pi)->_M_use_count + 1;
            }
          }
          local_298.m_data[2] = 0.0;
          local_268._0_8_ = (ChMaterialSurfaceSMC *)0x3ff0000000000000;
          local_268.m_size.m_data[1] = 0.0;
          local_278 = local_228.m_data[0];
          local_208 = local_228.m_data[1];
          local_298.m_data[0] = 0.0;
          local_298.m_data[1] = 0.0;
          local_268.m_density = 0.0;
          local_268.m_size.m_data[0] = 0.0;
          ChVisualMaterial::Default();
          AddCapsuleGeometry(this_01,&local_188,local_278,local_208,&local_298,
                             (ChQuaternion<double> *)&local_268,true,&local_a0);
          _Var16._M_pi = local_188.
                         super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          if (local_a0.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_a0.
                       super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            _Var16._M_pi = local_188.
                           super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
          }
          break;
        case BISPHERE:
          local_178.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = &local_2a8->super_ChMaterialSurface;
          local_178.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = _Stack_2a0._M_pi;
          if (_Stack_2a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (_Stack_2a0._M_pi)->_M_use_count = (_Stack_2a0._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (_Stack_2a0._M_pi)->_M_use_count = (_Stack_2a0._M_pi)->_M_use_count + 1;
            }
          }
          local_298.m_data[2] = 0.0;
          local_268._0_8_ = (ChMaterialSurfaceSMC *)0x3ff0000000000000;
          local_268.m_size.m_data[1] = 0.0;
          local_278 = local_228.m_data[0];
          local_208 = local_228.m_data[1];
          local_298.m_data[0] = 0.0;
          local_298.m_data[1] = 0.0;
          local_268.m_density = 0.0;
          local_268.m_size.m_data[0] = 0.0;
          ChVisualMaterial::Default();
          AddBiSphereGeometry(this_01,&local_178,local_278,local_208,&local_298,
                              (ChQuaternion<double> *)&local_268,true,&local_90);
          _Var16._M_pi = local_178.
                         super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          if (local_90.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_90.
                       super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            _Var16._M_pi = local_178.
                           super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
          }
          break;
        case ROUNDEDCYLINDER:
          local_198.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>._M_ptr
               = &local_2a8->super_ChMaterialSurface;
          local_198.super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi = _Stack_2a0._M_pi;
          if (_Stack_2a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              (_Stack_2a0._M_pi)->_M_use_count = (_Stack_2a0._M_pi)->_M_use_count + 1;
              UNLOCK();
            }
            else {
              (_Stack_2a0._M_pi)->_M_use_count = (_Stack_2a0._M_pi)->_M_use_count + 1;
            }
          }
          local_298.m_data[2] = 0.0;
          local_268._0_8_ = (ChMaterialSurfaceSMC *)0x3ff0000000000000;
          local_268.m_size.m_data[1] = 0.0;
          local_278 = local_228.m_data[0];
          local_208 = local_228.m_data[1];
          local_f0 = local_228.m_data[2];
          local_298.m_data[0] = 0.0;
          local_298.m_data[1] = 0.0;
          local_268.m_density = 0.0;
          local_268.m_size.m_data[0] = 0.0;
          ChVisualMaterial::Default();
          AddRoundedCylinderGeometry
                    (this_01,&local_198,local_278,local_208,local_f0,&local_298,
                     (ChQuaternion<double> *)&local_268,true,&local_b0);
          _Var16._M_pi = local_198.
                         super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>.
                         _M_refcount._M_pi;
          if (local_b0.super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_b0.
                       super___shared_ptr<chrono::ChVisualMaterial,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
            _Var16._M_pi = local_198.
                           super___shared_ptr<chrono::ChMaterialSurface,_(__gnu_cxx::_Lock_policy)2>
                           ._M_refcount._M_pi;
          }
          break;
        default:
          goto switchD_0091886d_default;
        }
        if (_Var16._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Var16._M_pi);
        }
switchD_0091886d_default:
        peVar3 = (this_01->collision_model).
                 super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                 ._M_ptr;
        p_Var4 = (this_01->collision_model).
                 super___shared_ptr<chrono::collision::ChCollisionModel,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi;
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
            UNLOCK();
          }
          else {
            p_Var4->_M_use_count = p_Var4->_M_use_count + 1;
          }
        }
        (*peVar3->_vptr_ChCollisionModel[4])();
        if (p_Var4 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var4);
        }
        local_298.m_data[0] = (double)this_01;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::__shared_count<chrono::ChBody*>
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_298.m_data + 1),this_01);
        pPVar9 = local_1f0;
        pCVar5 = this->m_system;
        local_1a8 = (ChBody *)local_298.m_data[0];
        p_Stack_1a0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.m_data[1];
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.m_data[1] !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)((long)local_298.m_data[1] + 8) =
                 *(_Atomic_word *)((long)local_298.m_data[1] + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)((long)local_298.m_data[1] + 8) =
                 *(_Atomic_word *)((long)local_298.m_data[1] + 8) + 1;
          }
        }
        (*(pCVar5->super_ChIntegrableIIorder).super_ChIntegrable._vptr_ChIntegrable[0x25])
                  (pCVar5,&local_1a8);
        if (p_Stack_1a0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1a0);
        }
        plVar6 = *(long **)&(((this->m_mixture).
                              super__Vector_base<std::shared_ptr<chrono::utils::MixtureIngredient>,_std::allocator<std::shared_ptr<chrono::utils::MixtureIngredient>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[iVar10].
                              super___shared_ptr<chrono::utils::MixtureIngredient,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr)->add_body_callback).
                            super___shared_ptr<chrono::utils::MixtureIngredient::AddBodyCallback,_(__gnu_cxx::_Lock_policy)2>
        ;
        if (plVar6 != (long *)0x0) {
          local_1b8 = (ChBody *)local_298.m_data[0];
          p_Stack_1b0 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.m_data[1];
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.m_data[1] !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            if (__libc_single_threaded == '\0') {
              LOCK();
              *(_Atomic_word *)((long)local_298.m_data[1] + 8) =
                   *(_Atomic_word *)((long)local_298.m_data[1] + 8) + 1;
              UNLOCK();
            }
            else {
              *(_Atomic_word *)((long)local_298.m_data[1] + 8) =
                   *(_Atomic_word *)((long)local_298.m_data[1] + 8) + 1;
            }
          }
          (**(code **)(*plVar6 + 0x10))(plVar6,&local_1b8);
          if (p_Stack_1b0 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Stack_1b0);
          }
        }
        local_268.m_type =
             ((this->m_mixture).
              super__Vector_base<std::shared_ptr<chrono::utils::MixtureIngredient>,_std::allocator<std::shared_ptr<chrono::utils::MixtureIngredient>_>_>
              ._M_impl.super__Vector_impl_data._M_start[iVar10].
              super___shared_ptr<chrono::utils::MixtureIngredient,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr)->m_type;
        local_268.m_density = (double)local_1e8;
        local_268.m_size.m_data[0] = local_228.m_data[0];
        local_268.m_size.m_data[1] = local_228.m_data[1];
        local_268.m_size.m_data[2] = local_228.m_data[2];
        local_268.m_body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)local_298.m_data[0];
        local_268.m_body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.m_data[1];
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.m_data[1] !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            *(_Atomic_word *)((long)local_298.m_data[1] + 8) =
                 *(_Atomic_word *)((long)local_298.m_data[1] + 8) + 1;
            UNLOCK();
          }
          else {
            *(_Atomic_word *)((long)local_298.m_data[1] + 8) =
                 *(_Atomic_word *)((long)local_298.m_data[1] + 8) + 1;
          }
        }
        std::
        vector<chrono::utils::Generator::BodyInfo,_std::allocator<chrono::utils::Generator::BodyInfo>_>
        ::emplace_back<chrono::utils::Generator::BodyInfo>(local_e8,&local_268);
        if (local_268.m_body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_268.m_body.super___shared_ptr<chrono::ChBody,_(__gnu_cxx::_Lock_policy)2>
                     ._M_refcount._M_pi);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.m_data[1] !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_298.m_data[1]);
        }
        if (_Stack_2a0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_2a0._M_pi);
        }
        pCVar12 = (pPVar9->
                  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        pCVar13 = (pPVar9->
                  super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                  )._M_impl.super__Vector_impl_data._M_finish;
      }
      uVar17 = uVar17 + 1;
      lVar15 = lVar15 + 0x18;
      uVar14 = ((long)pCVar13 - (long)pCVar12 >> 3) * -0x5555555555555555;
    } while (uVar17 <= uVar14 && uVar14 - uVar17 != 0);
  }
  this->m_totalNumBodies = this->m_totalNumBodies + (int)uVar14;
  if (local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start
      .super__Bit_iterator_base._M_p != (_Bit_type *)0x0) {
    operator_delete(local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                    super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                    (long)local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_end_of_storage -
                    (long)local_1e0.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
  }
  return;
}

Assistant:

void Generator::createObjects(const PointVector& points, const ChVector<>& vel) {
    bool check = false;
    std::vector<bool> flags;
    if (m_callback) {
        flags.resize(points.size(), true);
        m_callback->OnCreateObjects(points, flags);
        check = true;
    }

    for (int i = 0; i < points.size(); i++) {
        if (check && !flags[i])
            continue;

        // Select the type of object to be created.
        int index = selectIngredient();

        // Create a contact material consistent with the associated system and modify it based on attributes of the
        // current ingredient.
        std::shared_ptr<ChMaterialSurface> mat;
        switch (m_system->GetContactMethod()) {
            case ChContactMethod::NSC: {
                auto matNSC = chrono_types::make_shared<ChMaterialSurfaceNSC>();
                m_mixture[index]->setMaterialProperties(matNSC);
                mat = matNSC;
                break;
            }
            case ChContactMethod::SMC: {
                auto matSMC = chrono_types::make_shared<ChMaterialSurfaceSMC>();
                m_mixture[index]->setMaterialProperties(matSMC);
                mat = matSMC;
                break;
            }
        }

        // Create the body (with appropriate collision model, consistent with the associated system)
        ChBody* body = m_system->NewBody();

        // Set identifier
        body->SetIdentifier(m_crtBodyId++);

        // Set position and orientation
        body->SetPos(points[i]);
        body->SetRot(ChQuaternion<>(1, 0, 0, 0));
        body->SetPos_dt(vel);
        body->SetBodyFixed(false);
        body->SetCollide(true);

        // Get size and density; calculate geometric properties
        ChVector<> size = m_mixture[index]->getSize();
        double density = m_mixture[index]->getDensity();
        double volume;
        ChVector<> gyration;
        m_mixture[index]->calcGeometricProps(size, volume, gyration);
        double mass = density * volume;

        // Set mass properties
        body->SetMass(mass);
        body->SetInertiaXX(mass * gyration);
        m_totalMass += mass;
        m_totalVolume += volume;

        // Add collision geometry
        body->GetCollisionModel()->ClearModel();

        switch (m_mixture[index]->m_type) {
            case MixtureType::SPHERE:
                AddSphereGeometry(body, mat, size.x());
                break;
            case MixtureType::ELLIPSOID:
                AddEllipsoidGeometry(body, mat, size);
                break;
            case MixtureType::BOX:
                AddBoxGeometry(body, mat, size);
                break;
            case MixtureType::CYLINDER:
                AddCylinderGeometry(body, mat, size.x(), size.y());
                break;
            case MixtureType::CONE:
                AddConeGeometry(body, mat, size.x(), size.y());
                break;
            case MixtureType::BISPHERE:
            	AddBiSphereGeometry(body, mat, size.x(), size.y());
                break;
            case MixtureType::CAPSULE:
                AddCapsuleGeometry(body, mat, size.x(), size.y());
                break;
            case MixtureType::ROUNDEDCYLINDER:
                AddRoundedCylinderGeometry(body, mat, size.x(), size.y(), size.z());
                break;
        }

        body->GetCollisionModel()->BuildModel();

        // Attach the body to the system and append to list of generated bodies.
        std::shared_ptr<ChBody> bodyPtr(body);

        m_system->AddBody(bodyPtr);

        // If the callback pointer is set, call the function with the body pointer
        if (m_mixture[index]->add_body_callback) {
            m_mixture[index]->add_body_callback->OnAddBody(bodyPtr);
        }

        m_bodies.push_back(BodyInfo(m_mixture[index]->m_type, density, size, bodyPtr));
    }

    m_totalNumBodies += (unsigned int)points.size();
}